

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O1

void av1_get_tile_limits(AV1_COMMON *cm)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  bVar2 = (byte)cm->seq_params->mib_size_log2;
  iVar6 = (1 << (bVar2 & 0x1f)) + -1;
  iVar5 = (cm->mi_params).mi_cols + iVar6 >> (bVar2 & 0x1f);
  iVar4 = (cm->mi_params).mi_rows;
  uVar7 = 0x1000 >> (bVar2 + 2 & 0x1f);
  (cm->tiles).max_width_sb = uVar7;
  uVar1 = 0xffffffff;
  do {
    uVar1 = uVar1 + 1;
  } while ((int)(uVar7 << ((byte)uVar1 & 0x1f)) < iVar5);
  iVar6 = iVar6 + iVar4 >> (bVar2 & 0x1f);
  (cm->tiles).min_log2_cols = uVar1;
  iVar4 = 0x40;
  if (iVar5 < 0x40) {
    iVar4 = iVar5;
  }
  iVar3 = -1;
  do {
    iVar3 = iVar3 + 1;
  } while (1 << ((byte)iVar3 & 0x1f) < iVar4);
  (cm->tiles).max_log2_cols = iVar3;
  iVar4 = 0x40;
  if (iVar6 < 0x40) {
    iVar4 = iVar6;
  }
  iVar3 = -1;
  do {
    iVar3 = iVar3 + 1;
  } while (1 << ((byte)iVar3 & 0x1f) < iVar4);
  (cm->tiles).max_log2_rows = iVar3;
  uVar7 = 0xffffffff;
  do {
    uVar7 = uVar7 + 1;
  } while ((int)((0x900000U >> (bVar2 * '\x02' + 4 & 0x1f)) << ((byte)uVar7 & 0x1f)) < iVar5 * iVar6
          );
  if (uVar1 < uVar7) {
    uVar1 = uVar7;
  }
  (cm->tiles).min_log2 = uVar1;
  return;
}

Assistant:

void av1_get_tile_limits(AV1_COMMON *const cm) {
  const SequenceHeader *const seq_params = cm->seq_params;
  CommonTileParams *const tiles = &cm->tiles;
  const int sb_cols =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_cols, seq_params->mib_size_log2);
  const int sb_rows =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_rows, seq_params->mib_size_log2);

  const int sb_size_log2 = seq_params->mib_size_log2 + MI_SIZE_LOG2;
  tiles->max_width_sb = MAX_TILE_WIDTH >> sb_size_log2;

#if CONFIG_CWG_C013
  bool use_level_7_above = false;
  for (int i = 0; i < seq_params->operating_points_cnt_minus_1 + 1; i++) {
    if (seq_params->seq_level_idx[i] >= SEQ_LEVEL_7_0 &&
        seq_params->seq_level_idx[i] <= SEQ_LEVEL_8_3) {
      // Currently it is assumed that levels 7.x and 8.x are either used for all
      // operating points, or none of them.
      if (i != 0 && !use_level_7_above) {
        aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                           "Either all the operating points are levels 7.x or "
                           "8.x, or none of them are.");
      }
      use_level_7_above = true;
    }
  }
  const int max_tile_area_sb =
      (use_level_7_above ? MAX_TILE_AREA_LEVEL_7_AND_ABOVE : MAX_TILE_AREA) >>
      (2 * sb_size_log2);
#else
  const int max_tile_area_sb = MAX_TILE_AREA >> (2 * sb_size_log2);
#endif

  tiles->min_log2_cols = tile_log2(tiles->max_width_sb, sb_cols);
  tiles->max_log2_cols = tile_log2(1, AOMMIN(sb_cols, MAX_TILE_COLS));
  tiles->max_log2_rows = tile_log2(1, AOMMIN(sb_rows, MAX_TILE_ROWS));
  tiles->min_log2 = tile_log2(max_tile_area_sb, sb_cols * sb_rows);
  tiles->min_log2 = AOMMAX(tiles->min_log2, tiles->min_log2_cols);
}